

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

void __thiscall Interpreter::run(Interpreter *this)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  ulong uVar4;
  code *pcVar5;
  long *plVar6;
  
  pCVar1 = (this->callList).
           super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar2 = (this->callList).
           super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    uVar4 = (ulong)this->currentOp;
    if ((ulong)(((long)pCVar1 - (long)pCVar2) / 0x18) <= uVar4) break;
    this->currentOp = this->currentOp + 1;
    pCVar3 = (this->callList).
             super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = (code *)pCVar3[uVar4].func;
    plVar6 = (long *)((long)&this->res + *(long *)&pCVar3[uVar4].field_0x8);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    (*pcVar5)(plVar6,pCVar3[uVar4].data);
  }
  return;
}

Assistant:

void Interpreter::run() {
    unsigned long size = callList.size();
    while (currentOp < size) {
        Call c = callList[currentOp++];
        (this->*c.func)(c.data);
    }
}